

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O1

llparse_match_t
llparse__match_sequence_to_lower
          (llhttp__internal_t *s,uchar *p,uchar *endp,uchar *seq,uint32_t seq_len)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  ulong in_RAX;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  char cVar7;
  llparse_match_t lVar8;
  
  uVar6 = s->_index;
  pbVar4 = p;
  if (p != endp) {
    do {
      bVar2 = *pbVar4;
      bVar5 = bVar2 | 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        bVar5 = bVar2;
      }
      uVar1 = uVar6 + 1;
      uVar3 = 0;
      if (uVar1 != seq_len) {
        uVar3 = in_RAX & 0xffffffff;
      }
      in_RAX = uVar3;
      bVar2 = seq[uVar6];
      if (bVar5 != bVar2) {
        in_RAX = 2;
      }
      cVar7 = (uVar1 == seq_len) * '\x05';
      if (bVar5 != bVar2) {
        cVar7 = '\x05';
      }
      if (cVar7 != '\0') {
        if (cVar7 != '\x05') goto LAB_00108c12;
        uVar6 = 0;
        goto LAB_00108c10;
      }
      if (bVar5 != bVar2) {
        uVar1 = uVar6;
      }
      uVar6 = uVar1;
      pbVar4 = pbVar4 + 1;
      p = endp;
    } while (pbVar4 != endp);
  }
  in_RAX = 1;
  pbVar4 = p;
LAB_00108c10:
  s->_index = uVar6;
LAB_00108c12:
  lVar8.current = pbVar4;
  lVar8._0_8_ = in_RAX;
  return lVar8;
}

Assistant:

static llparse_match_t llparse__match_sequence_to_lower(
    llhttp__internal_t* s, const unsigned char* p,
    const unsigned char* endp,
    const unsigned char* seq, uint32_t seq_len) {
  uint32_t index;
  llparse_match_t res;

  index = s->_index;
  for (; p != endp; p++) {
    unsigned char current;

    current = ((*p) >= 'A' && (*p) <= 'Z' ? (*p | 0x20) : (*p));
    if (current == seq[index]) {
      if (++index == seq_len) {
        res.status = kMatchComplete;
        goto reset;
      }
    } else {
      res.status = kMatchMismatch;
      goto reset;
    }
  }
  s->_index = index;
  res.status = kMatchPause;
  res.current = p;
  return res;
reset:
  s->_index = 0;
  res.current = p;
  return res;
}